

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extend.cpp
# Opt level: O1

void __thiscall CaDiCaL::External::push_witness_literal_on_extension_stack(External *this,int ilit)

{
  int iVar1;
  iterator __position;
  bool bVar2;
  ulong uVar3;
  int elit;
  int local_14;
  
  uVar3 = (ulong)(uint)-ilit;
  if (0 < ilit) {
    uVar3 = (ulong)(uint)ilit;
  }
  iVar1 = (this->internal->i2e).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar3];
  local_14 = -iVar1;
  if (-1 < ilit) {
    local_14 = iVar1;
  }
  __position._M_current =
       (this->extension).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->extension).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&this->extension,__position,&local_14);
  }
  else {
    *__position._M_current = local_14;
    (this->extension).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = __position._M_current + 1;
  }
  bVar2 = marked(this,&this->witness,local_14);
  if (!bVar2) {
    mark(this,&this->witness,local_14);
  }
  return;
}

Assistant:

void External::push_witness_literal_on_extension_stack (int ilit) {
  assert (ilit);
  const int elit = internal->externalize (ilit);
  assert (elit);
  extension.push_back (elit);
  LOG ("pushing witness literal %d on extension stack (internal %d)", elit,
       ilit);
  if (marked (witness, elit))
    return;
  LOG ("marking witness %d", elit);
  mark (witness, elit);
}